

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

void __thiscall
QTableWidget::setVerticalHeaderItem(QTableWidget *this,int row,QTableWidgetItem *item)

{
  QTableWidgetPrivate *this_00;
  QTableModel *this_01;
  QTableWidgetItem *pQVar1;
  
  if (item != (QTableWidgetItem *)0x0) {
    this_00 = *(QTableWidgetPrivate **)
               &(this->super_QTableView).super_QAbstractItemView.super_QAbstractScrollArea.
                super_QFrame.super_QWidget.field_0x8;
    item->view = this;
    this_01 = QTableWidgetPrivate::tableModel(this_00);
    QTableModel::setVerticalHeaderItem(this_01,row,item);
    return;
  }
  pQVar1 = takeVerticalHeaderItem(this,row);
  if (pQVar1 != (QTableWidgetItem *)0x0) {
    (*pQVar1->_vptr_QTableWidgetItem[1])(pQVar1);
    return;
  }
  return;
}

Assistant:

void QTableWidget::setVerticalHeaderItem(int row, QTableWidgetItem *item)
{
    Q_D(QTableWidget);
    if (item) {
        item->view = this;
        d->tableModel()->setVerticalHeaderItem(row, item);
    } else {
        delete takeVerticalHeaderItem(row);
    }
}